

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormalsUtil.h
# Opt level: O0

void MapFormalsFromPattern<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
               (ParseNodeFnc *pnodeFunc,anon_class_24_3_c793ac44 fn)

{
  ParseNode *this;
  ParseNodeParamPattern *pPVar1;
  ParseNodePtr rest;
  ParseNode *local_18;
  ParseNode *pnode;
  ParseNodeFnc *pnodeFunc_local;
  
  for (local_18 = pnodeFunc->pnodeParams; local_18 != (ParseNode *)0x0;
      local_18 = ParseNode::GetFormalNext(local_18)) {
    if (local_18->nop == knopParamPattern) {
      pPVar1 = ParseNode::AsParseNodeParamPattern(local_18);
      Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
                ((pPVar1->super_ParseNodeUni).pnode1,fn);
    }
  }
  this = pnodeFunc->pnodeRest;
  if ((this != (ParseNode *)0x0) && (this->nop == knopParamPattern)) {
    pPVar1 = ParseNode::AsParseNodeParamPattern(this);
    Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
              ((pPVar1->super_ParseNodeUni).pnode1,fn);
  }
  return;
}

Assistant:

void MapFormalsFromPattern(ParseNodeFnc *pnodeFunc, Fn fn)
{
    for (ParseNode *pnode = pnodeFunc->pnodeParams; pnode != nullptr; pnode = pnode->GetFormalNext())
    {
        if (pnode->nop == knopParamPattern)
        {
            Parser::MapBindIdentifier(pnode->AsParseNodeParamPattern()->pnode1, fn);
        }
    }

    ParseNodePtr rest = pnodeFunc->pnodeRest;
    if (rest != nullptr && rest->nop == knopParamPattern)
    {
        Parser::MapBindIdentifier(rest->AsParseNodeParamPattern()->pnode1, fn);
    }
}